

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_SimAbsInit(Gia_SimAbsMan_t *p)

{
  uint uVar1;
  uint uVar2;
  int Entry;
  int Entry_00;
  Vec_Int_t *p_00;
  int *__ptr;
  int *__ptr_00;
  uint uVar3;
  Vec_Int_t *__ptr_01;
  Vec_Int_t *__ptr_02;
  int iVar4;
  
  __ptr_01 = Gia_SimAbsFind(p->vValues,0);
  __ptr_02 = Gia_SimAbsFind(p->vValues,1);
  p->vPatPairs->nSize = 0;
  uVar1 = __ptr_01->nSize;
  uVar2 = __ptr_02->nSize;
  printf("There are %d offset and %d onset minterms (%d pairs) and %d divisors.\n",(ulong)uVar1,
         (ulong)uVar2,(ulong)(uVar2 * uVar1),(ulong)(uint)p->nCands);
  Abc_Random(1);
  if ((int)uVar1 < 1) {
    __assert_fail("Vec_IntSize(vValue0) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x51a,"void Gia_SimAbsInit(Gia_SimAbsMan_t *)");
  }
  if ((int)uVar2 < 1) {
    __assert_fail("Vec_IntSize(vValue1) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x51b,"void Gia_SimAbsInit(Gia_SimAbsMan_t *)");
  }
  iVar4 = 0x40;
  while( true ) {
    p_00 = p->vPatPairs;
    uVar3 = Abc_Random(0);
    if ((int)((ulong)uVar3 % (ulong)uVar1) < 0) break;
    __ptr = __ptr_01->pArray;
    Entry = __ptr[(ulong)uVar3 % (ulong)uVar1];
    uVar3 = Abc_Random(0);
    if ((int)((ulong)uVar3 % (ulong)uVar2) < 0) break;
    __ptr_00 = __ptr_02->pArray;
    Entry_00 = __ptr_00[(ulong)uVar3 % (ulong)uVar2];
    Vec_IntPush(p_00,Entry);
    Vec_IntPush(p_00,Entry_00);
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      free(__ptr);
      free(__ptr_01);
      free(__ptr_00);
      free(__ptr_02);
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_SimAbsInit( Gia_SimAbsMan_t * p )
{
    int n, nPairsInit = 64;
    Vec_Int_t * vValue0 = Gia_SimAbsFind( p->vValues, 0 );
    Vec_Int_t * vValue1 = Gia_SimAbsFind( p->vValues, 1 );
    Vec_IntClear( p->vPatPairs );
    printf( "There are %d offset and %d onset minterms (%d pairs) and %d divisors.\n", 
        Vec_IntSize(vValue0), Vec_IntSize(vValue1), Vec_IntSize(vValue0)*Vec_IntSize(vValue1), p->nCands );
    Abc_Random( 1 );
    assert( Vec_IntSize(vValue0) > 0 );
    assert( Vec_IntSize(vValue1) > 0 );
    for ( n = 0; n < nPairsInit; n++ )
        Vec_IntPushTwo( p->vPatPairs, 
            Vec_IntEntry(vValue0, Abc_Random(0) % Vec_IntSize(vValue0)), 
            Vec_IntEntry(vValue1, Abc_Random(0) % Vec_IntSize(vValue1)) );
    Vec_IntFree( vValue0 );
    Vec_IntFree( vValue1 );
}